

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:144:78)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_string_object_cpp:144:78)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr_untyped *this_00;
  
  make_string_object::anon_class_32_2_842af841::operator()(&(this->f).check_type,this_);
  this_00 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  gc_heap_ptr_untyped::get(this_00);
  string_object::string_value((string_object *)&stack0xffffffffffffffe0);
  value::value(__return_storage_ptr__,(string *)&stack0xffffffffffffffe0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }